

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O1

void list_push_front(list *list,list_elem *e)

{
  list_elem *plVar1;
  
  plVar1 = list->head;
  if (plVar1 != (list_elem *)0x0) {
    plVar1->prev = e;
    e->prev = (list_elem *)0x0;
    e->next = plVar1;
    list->head = e;
    return;
  }
  list->head = e;
  list->tail = e;
  e->prev = (list_elem *)0x0;
  e->next = (list_elem *)0x0;
  return;
}

Assistant:

void list_push_front(struct list *list, struct list_elem *e)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    if (list->head == NULL) {
        list->head = e;
        list->tail = e;
        e->next = e->prev = NULL;
    }else{
        list->head->prev = e;
        e->prev = NULL;
        e->next = list->head;
        list->head = e;
    }
    IFDEF_LOCK( spin_unlock(&list->lock); );
}